

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDisplayer.cpp
# Opt level: O2

void __thiscall
TextDisplayer::writeText(TextDisplayer *this,string *text,GLint pixelSize,bool rotateColours)

{
  int iVar1;
  char *pcVar2;
  Colour *this_00;
  GLfloat *pGVar3;
  char *pcVar4;
  int colourAlias;
  int iVar5;
  
  colourAlias = 0;
  pcVar2 = (text->_M_dataplus)._M_p;
  for (pcVar4 = pcVar2; pcVar4 != pcVar2 + text->_M_string_length; pcVar4 = pcVar4 + 1) {
    if (rotateColours) {
      this_00 = Palette::getColour(this->palette,colourAlias);
      pGVar3 = Colour::getColour3fv(this_00);
      glColor3fv(pGVar3);
      iVar5 = colourAlias + 1;
      iVar1 = Palette::getPrimaryColourCount(this->palette);
      colourAlias = 0;
      if (iVar5 != iVar1) {
        colourAlias = iVar5;
      }
    }
    drawCharacter(this,*pcVar4,pixelSize);
    glTranslatef((float)pixelSize,0,0);
    pcVar2 = (text->_M_dataplus)._M_p;
  }
  return;
}

Assistant:

void TextDisplayer::writeText(const string& text, GLint pixelSize, bool rotateColours) {
    int i = 0;
    for(auto it = text.begin(); it != text.end(); ++it) {
        if (rotateColours) {
            glColor3fv(palette->getColour(i)->getColour3fv());
            if (++i == palette->getPrimaryColourCount()) {
                i = 0;
            }
        }
        drawCharacter(*it, pixelSize);
        glTranslatef(pixelSize, 0.0f, 0.0f);
    }
}